

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_split_clients_module.c
# Opt level: O3

char * ngx_conf_split_clients_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_pool_t *pool;
  void *pvVar1;
  ngx_int_t nVar2;
  ngx_stream_variable_t *pnVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  ngx_conf_t *pnVar7;
  undefined8 *puVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  byte bVar13;
  undefined8 local_c8;
  ngx_conf_t save;
  undefined1 auStack_48 [8];
  ngx_str_t name;
  
  bVar13 = 0;
  pvVar1 = ngx_pcalloc(cf->pool,0x50);
  pcVar12 = (char *)0xffffffffffffffff;
  if (pvVar1 != (void *)0x0) {
    pvVar4 = cf->args->elts;
    save.handler_conf = (char *)cf;
    nVar2 = ngx_stream_compile_complex_value
                      ((ngx_stream_compile_complex_value_t *)&save.handler_conf);
    if (nVar2 == 0) {
      auStack_48 = *(undefined1 (*) [8])((long)pvVar4 + 0x20);
      name.len = *(undefined8 *)((long)pvVar4 + 0x28);
      if (*(char *)name.len == '$') {
        auStack_48 = (undefined1  [8])((long)auStack_48 - 1);
        name.len = name.len + 1;
        pnVar3 = ngx_stream_add_variable(cf,(ngx_str_t *)auStack_48,1);
        if (pnVar3 != (ngx_stream_variable_t *)0x0) {
          pnVar3->get_handler = ngx_stream_split_clients_variable;
          pnVar3->data = (uintptr_t)pvVar1;
          pool = cf->pool;
          *(undefined8 *)((long)pvVar1 + 0x30) = 0;
          *(undefined8 *)((long)pvVar1 + 0x38) = 0x18;
          *(undefined8 *)((long)pvVar1 + 0x40) = 2;
          *(ngx_pool_t **)((long)pvVar1 + 0x48) = pool;
          pvVar4 = ngx_palloc(pool,0x30);
          *(void **)((long)pvVar1 + 0x28) = pvVar4;
          if (pvVar4 != (void *)0x0) {
            pnVar7 = cf;
            puVar8 = &local_c8;
            for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
              *puVar8 = pnVar7->name;
              pnVar7 = (ngx_conf_t *)((long)pnVar7 + (ulong)bVar13 * -0x10 + 8);
              puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
            }
            cf->ctx = pvVar1;
            cf->handler = ngx_stream_split_clients;
            cf->handler_conf = (char *)conf;
            pcVar12 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
            puVar8 = &local_c8;
            pnVar7 = cf;
            for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
              pnVar7->name = (char *)*puVar8;
              puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
              pnVar7 = (ngx_conf_t *)((long)pnVar7 + (ulong)bVar13 * -0x10 + 8);
            }
            if (pcVar12 == (char *)0x0) {
              lVar5 = *(long *)((long)pvVar1 + 0x30);
              pcVar12 = (char *)0x0;
              if (lVar5 != 0) {
                puVar9 = *(uint **)((long)pvVar1 + 0x28);
                uVar10 = 0;
                uVar11 = 0;
                do {
                  uVar6 = (ulong)*puVar9;
                  uVar10 = uVar10 + *puVar9;
                  if (uVar6 == 0) {
                    uVar10 = 10000;
                  }
                  if (10000 < uVar10) {
                    ngx_conf_log_error(1,cf,0,"percent total is greater than 100%%");
                    return (char *)0xffffffffffffffff;
                  }
                  if (uVar6 != 0) {
                    uVar11 = uVar11 + (int)(((uVar6 << 0x20) - uVar6) / 10000);
                    *puVar9 = uVar11;
                  }
                  puVar9 = puVar9 + 6;
                  lVar5 = lVar5 + -1;
                } while (lVar5 != 0);
              }
            }
          }
        }
      }
      else {
        ngx_conf_log_error(1,cf,0,"invalid variable name \"%V\"",auStack_48);
      }
    }
  }
  return pcVar12;
}

Assistant:

static char *
ngx_conf_split_clients_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char                                *rv;
    uint32_t                             sum, last;
    ngx_str_t                           *value, name;
    ngx_uint_t                           i;
    ngx_conf_t                           save;
    ngx_stream_variable_t               *var;
    ngx_stream_split_clients_ctx_t      *ctx;
    ngx_stream_split_clients_part_t     *part;
    ngx_stream_compile_complex_value_t   ccv;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_stream_split_clients_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_stream_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &ctx->value;

    if (ngx_stream_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    name = value[2];

    if (name.data[0] != '$') {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid variable name \"%V\"", &name);
        return NGX_CONF_ERROR;
    }

    name.len--;
    name.data++;

    var = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
    if (var == NULL) {
        return NGX_CONF_ERROR;
    }

    var->get_handler = ngx_stream_split_clients_variable;
    var->data = (uintptr_t) ctx;

    if (ngx_array_init(&ctx->parts, cf->pool, 2,
                       sizeof(ngx_stream_split_clients_part_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    save = *cf;
    cf->ctx = ctx;
    cf->handler = ngx_stream_split_clients;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }

    sum = 0;
    last = 0;
    part = ctx->parts.elts;

    for (i = 0; i < ctx->parts.nelts; i++) {
        sum = part[i].percent ? sum + part[i].percent : 10000;
        if (sum > 10000) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "percent total is greater than 100%%");
            return NGX_CONF_ERROR;
        }

        if (part[i].percent) {
            last += part[i].percent * (uint64_t) 0xffffffff / 10000;
            part[i].percent = last;
        }
    }

    return rv;
}